

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall google::protobuf::UnknownField::Delete(UnknownField *this)

{
  UnknownFieldSet *this_00;
  pointer pUVar1;
  
  if (this->type_ == 4) {
    this_00 = (this->data_).group_;
    if (this_00 == (UnknownFieldSet *)0x0) {
      return;
    }
    if ((this_00->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this_00->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      UnknownFieldSet::ClearFallback(this_00);
    }
    pUVar1 = (this_00->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pUVar1 == (pointer)0x0) goto LAB_002b2060;
  }
  else {
    if ((this->type_ != 3) || (this_00 = (this->data_).group_, this_00 == (UnknownFieldSet *)0x0)) {
      return;
    }
    pUVar1 = (this_00->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pUVar1 == (pointer)&(this_00->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_002b2060;
  }
  operator_delete(pUVar1);
LAB_002b2060:
  operator_delete(this_00);
  return;
}

Assistant:

const char* ParseGroup(uint32 num, const char* ptr, ParseContext* ctx) {
    UnknownFieldParserHelper child(unknown_->AddGroup(num));
    return ctx->ParseGroup(&child, ptr, num * 8 + 3);
  }